

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

Abc_Ntk_t * Ver_ParseFindOrCreateNetwork(Ver_Man_t *pMan,char *pName)

{
  Abc_Ntk_t *pNtk;
  char *pcVar1;
  
  pNtk = Abc_DesFindModelByName(pMan->pDesign,pName);
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_BLACKBOX,pMan->fUseMemMan);
    pcVar1 = Extra_UtilStrsav(pName);
    pNtk->pName = pcVar1;
    pNtk->pSpec = (char *)0x0;
    Abc_DesAddModel(pMan->pDesign,pNtk);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Ver_ParseFindOrCreateNetwork( Ver_Man_t * pMan, char * pName )
{
    Abc_Ntk_t * pNtkNew;
    // check if the network exists
    if ( (pNtkNew = Abc_DesFindModelByName( pMan->pDesign, pName )) )
        return pNtkNew;
//printf( "Creating network %s.\n", pName );
    // create new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_BLACKBOX, pMan->fUseMemMan );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = NULL;
    // add module to the design
    Abc_DesAddModel( pMan->pDesign, pNtkNew );
    return pNtkNew;
}